

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O0

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
duckdb::JoinRef::Deserialize(Deserializer *deserializer)

{
  Deserializer *this;
  pointer tag;
  Deserializer *this_00;
  pointer pJVar1;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *in_RSI;
  unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_> in_RDI;
  unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> result;
  pointer in_stack_ffffffffffffff38;
  JoinRef *in_stack_ffffffffffffff40;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  *in_stack_ffffffffffffff48;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *pvVar2;
  Deserializer *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  field_id_t fVar3;
  Deserializer *in_stack_ffffffffffffff60;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *ret;
  field_id_t field_id;
  
  fVar3 = (field_id_t)((ulong)in_stack_ffffffffffffff58 >> 0x30);
  operator_new(0xc0);
  JoinRef(in_stack_ffffffffffffff40,(JoinRefType)((ulong)in_stack_ffffffffffffff38 >> 0x38));
  unique_ptr<duckdb::JoinRef,std::default_delete<duckdb::JoinRef>,true>::
  unique_ptr<std::default_delete<duckdb::JoinRef>,void>
            ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
             in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
            ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
             in_stack_ffffffffffffff40);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
            (in_stack_ffffffffffffff60,fVar3,(char *)in_stack_ffffffffffffff50,
             (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             in_stack_ffffffffffffff48);
  unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
            ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
             in_stack_ffffffffffffff40);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>>
            (in_stack_ffffffffffffff60,fVar3,(char *)in_stack_ffffffffffffff50,
             (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)
             in_stack_ffffffffffffff48);
  unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
            ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
             in_stack_ffffffffffffff40);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (in_stack_ffffffffffffff60,fVar3,(char *)in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  fVar3 = (field_id_t)((ulong)in_stack_ffffffffffffff48 >> 0x30);
  pvVar2 = in_RSI;
  this = (Deserializer *)
         unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                   ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                    in_stack_ffffffffffffff40);
  field_id = (field_id_t)((ulong)pvVar2 >> 0x30);
  Deserializer::ReadProperty<duckdb::JoinType>
            (in_stack_ffffffffffffff50,fVar3,(char *)in_stack_ffffffffffffff40,
             (JoinType *)in_stack_ffffffffffffff38);
  ret = in_RSI;
  tag = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                  ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                   in_stack_ffffffffffffff40);
  Deserializer::ReadProperty<duckdb::JoinRefType>
            (in_stack_ffffffffffffff50,fVar3,(char *)in_stack_ffffffffffffff40,
             (JoinRefType *)in_stack_ffffffffffffff38);
  pvVar2 = in_RSI;
  this_00 = (Deserializer *)
            unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                      ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                       in_stack_ffffffffffffff40);
  fVar3 = (field_id_t)((ulong)pvVar2 >> 0x30);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (this,field_id,(char *)tag,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)ret);
  pvVar2 = in_RSI;
  pJVar1 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      in_stack_ffffffffffffff40);
  Deserializer::ReadPropertyWithDefault<bool>(this_00,fVar3,(char *)pJVar1,(bool *)pvVar2);
  pJVar1 = unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::operator->
                     ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)
                      in_stack_ffffffffffffff40);
  Deserializer::
  ReadPropertyWithDefault<duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
            (this,field_id,(char *)tag,ret);
  unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>::
  unique_ptr<duckdb::JoinRef,std::default_delete<std::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>>>,void>
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)pJVar1,
             (unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>_> *)in_RSI);
  unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true>::~unique_ptr
            ((unique_ptr<duckdb::JoinRef,_std::default_delete<duckdb::JoinRef>,_true> *)0xae92c4);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (__uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         in_RDI._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
         ._M_t.super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<TableRef> JoinRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<JoinRef>(new JoinRef());
	deserializer.ReadPropertyWithDefault<unique_ptr<TableRef>>(200, "left", result->left);
	deserializer.ReadPropertyWithDefault<unique_ptr<TableRef>>(201, "right", result->right);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(202, "condition", result->condition);
	deserializer.ReadProperty<JoinType>(203, "join_type", result->type);
	deserializer.ReadProperty<JoinRefType>(204, "ref_type", result->ref_type);
	deserializer.ReadPropertyWithDefault<vector<string>>(205, "using_columns", result->using_columns);
	deserializer.ReadPropertyWithDefault<bool>(206, "delim_flipped", result->delim_flipped);
	deserializer.ReadPropertyWithDefault<vector<unique_ptr<ParsedExpression>>>(207, "duplicate_eliminated_columns", result->duplicate_eliminated_columns);
	return std::move(result);
}